

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 in_XMM6 [16];
  undefined1 auVar15 [16];
  
  uVar6 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar9 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  iVar1 = this->affine;
  uVar11 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar11;
  }
  pvVar3 = (this->gamma_data).data;
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar11;
  }
  pvVar4 = (this->beta_data).data;
  sVar5 = bottom_top_blob->elemsize;
  for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    fVar12 = 0.0;
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      fVar12 = fVar12 + *(float *)((long)pvVar9 + uVar10 * 4);
    }
    fVar12 = fVar12 * (1.0 / (float)(int)uVar6);
    fVar13 = 0.0;
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      fVar14 = *(float *)((long)pvVar9 + uVar10 * 4) - fVar12;
      fVar14 = fVar14 * fVar14;
      in_XMM6 = ZEXT416((uint)fVar14);
      fVar13 = fVar13 + fVar14;
    }
    fVar13 = fVar13 * (1.0 / (float)(int)uVar6);
    if (iVar1 == 0) {
      fVar13 = fVar13 + this->eps;
      auVar15 = rsqrtss(in_XMM6,ZEXT416((uint)fVar13));
      fVar14 = auVar15._0_4_;
      in_XMM6._4_12_ = auVar15._4_12_;
      in_XMM6._0_4_ = fVar14 * -0.5 * (fVar13 * fVar14 * fVar14 + -3.0);
      fVar12 = -fVar12 * in_XMM6._0_4_;
    }
    else {
      fVar13 = fVar13 + this->eps;
      auVar15 = rsqrtss(in_XMM6,ZEXT416((uint)fVar13));
      fVar14 = auVar15._0_4_;
      in_XMM6._4_12_ = auVar15._4_12_;
      in_XMM6._0_4_ =
           fVar14 * -0.5 * (fVar13 * fVar14 * fVar14 + -3.0) * *(float *)((long)pvVar3 + uVar11 * 4)
      ;
      fVar12 = *(float *)((long)pvVar4 + uVar11 * 4) - fVar12 * in_XMM6._0_4_;
    }
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      *(float *)((long)pvVar9 + uVar10 * 4) =
           *(float *)((long)pvVar9 + uVar10 * 4) * in_XMM6._0_4_ + fVar12;
    }
    pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar5);
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var + eps)) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int c = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < c; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i = 0; i < size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float a;
        float b;
        if (affine)
        {
            float gamma = gamma_data[q];
            float beta = beta_data[q];

            a = static_cast<float>(gamma / (sqrt(var + eps)));
            b = -mean * a + beta;
        }
        else
        {
            a = static_cast<float>(1.f / (sqrt(var + eps)));
            b = -mean * a;
        }

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}